

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O0

aiMesh * __thiscall Assimp::XGLImporter::ToOutputMesh(XGLImporter *this,TempMaterialMesh *m)

{
  float _x;
  uint uVar1;
  undefined1 auVar2 [16];
  aiMesh *this_00;
  size_type sVar3;
  pointer paVar4;
  aiVector3D *paVar5;
  const_reference pvVar6;
  ulong uVar7;
  size_type *psVar8;
  const_reference pvVar9;
  uint *puVar10;
  aiFace *paVar11;
  ulong uVar12;
  aiFace *local_158;
  aiVector3t<float> *local_110;
  aiVector3t<float> *local_d8;
  aiVector3t<float> *local_a8;
  uint local_74;
  uint c;
  aiFace *f;
  uint i_1;
  uint idx;
  float local_58;
  uint local_54;
  const_iterator cStack_50;
  uint i;
  __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_48;
  __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_40;
  __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_38;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> local_20;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> mesh;
  TempMaterialMesh *m_local;
  XGLImporter *this_local;
  
  mesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
  super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiMesh,_std::default_delete<aiMesh>,_true,_true>)
       (__uniq_ptr_data<aiMesh,_std::default_delete<aiMesh>,_true,_true>)m;
  this_00 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(this_00);
  std::unique_ptr<aiMesh,std::default_delete<aiMesh>>::unique_ptr<std::default_delete<aiMesh>,void>
            ((unique_ptr<aiMesh,std::default_delete<aiMesh>> *)&local_20,this_00);
  sVar3 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                     mesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                     super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                     super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl);
  paVar4 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_20);
  paVar4->mNumVertices = (uint)sVar3;
  paVar4 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_20);
  uVar7 = (ulong)paVar4->mNumVertices;
  paVar5 = (aiVector3D *)operator_new__(uVar7 * 0xc);
  if (uVar7 != 0) {
    local_a8 = paVar5;
    do {
      aiVector3t<float>::aiVector3t(local_a8);
      local_a8 = local_a8 + 1;
    } while (local_a8 != paVar5 + uVar7);
  }
  paVar4 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_20);
  paVar4->mVertices = paVar5;
  local_38._M_current =
       (aiVector3t<float> *)
       std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin
                 ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                  mesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                  super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl);
  local_40._M_current =
       (aiVector3t<float> *)
       std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end
                 ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                  mesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                  super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl);
  paVar4 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_20);
  std::
  copy<__gnu_cxx::__normal_iterator<aiVector3t<float>const*,std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>>,aiVector3t<float>*>
            (local_38,local_40,paVar4->mVertices);
  sVar3 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                     ((long)mesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>.
                            _M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                            super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x18));
  if (sVar3 != 0) {
    paVar4 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_20);
    uVar7 = (ulong)paVar4->mNumVertices;
    paVar5 = (aiVector3D *)operator_new__(uVar7 * 0xc);
    if (uVar7 != 0) {
      local_d8 = paVar5;
      do {
        aiVector3t<float>::aiVector3t(local_d8);
        local_d8 = local_d8 + 1;
      } while (local_d8 != paVar5 + uVar7);
    }
    paVar4 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_20);
    paVar4->mNormals = paVar5;
    local_48._M_current =
         (aiVector3t<float> *)
         std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin
                   ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                    ((long)mesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>.
                           _M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                           super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x18));
    cStack_50 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end
                          ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                           ((long)mesh._M_t.
                                  super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                                  super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x18));
    paVar4 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_20);
    std::
    copy<__gnu_cxx::__normal_iterator<aiVector3t<float>const*,std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>>,aiVector3t<float>*>
              (local_48,(__normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
                         )cStack_50._M_current,paVar4->mNormals);
  }
  sVar3 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::size
                    ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                     ((long)mesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>.
                            _M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                            super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x30));
  if (sVar3 != 0) {
    paVar4 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_20);
    paVar4->mNumUVComponents[0] = 2;
    paVar4 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_20);
    uVar7 = (ulong)paVar4->mNumVertices;
    paVar5 = (aiVector3D *)operator_new__(uVar7 * 0xc);
    if (uVar7 != 0) {
      local_110 = paVar5;
      do {
        aiVector3t<float>::aiVector3t(local_110);
        local_110 = local_110 + 1;
      } while (local_110 != paVar5 + uVar7);
    }
    paVar4 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_20);
    paVar4->mTextureCoords[0] = paVar5;
    for (local_54 = 0; uVar1 = local_54,
        paVar4 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_20),
        uVar1 < paVar4->mNumVertices; local_54 = local_54 + 1) {
      pvVar6 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::operator[]
                         ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                          ((long)mesh._M_t.
                                 super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                                 super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                                 super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x30),
                          (ulong)local_54);
      _x = pvVar6->x;
      pvVar6 = std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::operator[]
                         ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                          ((long)mesh._M_t.
                                 super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                                 super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                                 super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x30),
                          (ulong)local_54);
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)&i_1,_x,pvVar6->y,0.0);
      paVar4 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_20);
      paVar5 = paVar4->mTextureCoords[0] + local_54;
      paVar5->x = (float)i_1;
      paVar5->y = (float)idx;
      paVar5->z = local_58;
    }
  }
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     ((long)mesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>.
                            _M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                            super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x48));
  paVar4 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_20);
  paVar4->mNumFaces = (uint)sVar3;
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     ((long)mesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>.
                            _M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                            super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x48));
  auVar2._8_8_ = 0;
  auVar2._0_8_ = sVar3;
  uVar7 = SUB168(auVar2 * ZEXT816(0x10),0);
  uVar12 = uVar7 + 8;
  if (0xfffffffffffffff7 < uVar7) {
    uVar12 = 0xffffffffffffffff;
  }
  if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
    uVar12 = 0xffffffffffffffff;
  }
  psVar8 = (size_type *)operator_new__(uVar12);
  *psVar8 = sVar3;
  paVar11 = (aiFace *)(psVar8 + 1);
  if (sVar3 != 0) {
    local_158 = paVar11;
    do {
      aiFace::aiFace(local_158);
      local_158 = local_158 + 1;
    } while (local_158 != paVar11 + sVar3);
  }
  paVar4 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_20);
  paVar4->mFaces = paVar11;
  f._4_4_ = 0;
  for (f._0_4_ = 0;
      paVar4 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_20),
      (uint)f < paVar4->mNumFaces; f._0_4_ = (uint)f + 1) {
    paVar4 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_20);
    paVar11 = paVar4->mFaces + (uint)f;
    pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        ((long)mesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>
                               ._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                               super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x48),
                        (ulong)(uint)f);
    paVar11->mNumIndices = *pvVar9;
    puVar10 = (uint *)operator_new__((ulong)paVar11->mNumIndices << 2);
    paVar11->mIndices = puVar10;
    for (local_74 = 0; local_74 < paVar11->mNumIndices; local_74 = local_74 + 1) {
      paVar11->mIndices[local_74] = f._4_4_;
      f._4_4_ = f._4_4_ + 1;
    }
  }
  paVar4 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_20);
  if (f._4_4_ != paVar4->mNumVertices) {
    __assert_fail("idx == mesh->mNumVertices",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/XGL/XGLLoader.cpp"
                  ,0x235,"aiMesh *Assimp::XGLImporter::ToOutputMesh(const TempMaterialMesh &)");
  }
  uVar1 = *(uint *)((long)mesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t
                          .super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x60);
  paVar4 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_20);
  paVar4->mPrimitiveTypes = uVar1;
  uVar1 = *(uint *)((long)mesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t
                          .super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 100);
  paVar4 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_20);
  paVar4->mMaterialIndex = uVar1;
  paVar4 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::release(&local_20);
  std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::~unique_ptr(&local_20);
  return paVar4;
}

Assistant:

aiMesh* XGLImporter::ToOutputMesh(const TempMaterialMesh& m)
{
    std::unique_ptr<aiMesh> mesh(new aiMesh());

    mesh->mNumVertices = static_cast<unsigned int>(m.positions.size());
    mesh->mVertices = new aiVector3D[mesh->mNumVertices];
    std::copy(m.positions.begin(),m.positions.end(),mesh->mVertices);

    if(m.normals.size()) {
        mesh->mNormals = new aiVector3D[mesh->mNumVertices];
        std::copy(m.normals.begin(),m.normals.end(),mesh->mNormals);
    }

    if(m.uvs.size()) {
        mesh->mNumUVComponents[0] = 2;
        mesh->mTextureCoords[0] = new aiVector3D[mesh->mNumVertices];

        for(unsigned int i = 0; i < mesh->mNumVertices; ++i) {
            mesh->mTextureCoords[0][i] = aiVector3D(m.uvs[i].x,m.uvs[i].y,0.f);
        }
    }

    mesh->mNumFaces =  static_cast<unsigned int>(m.vcounts.size());
    mesh->mFaces = new aiFace[m.vcounts.size()];

    unsigned int idx = 0;
    for(unsigned int i = 0; i < mesh->mNumFaces; ++i) {
        aiFace& f = mesh->mFaces[i];
        f.mNumIndices = m.vcounts[i];
        f.mIndices = new unsigned int[f.mNumIndices];
        for(unsigned int c = 0; c < f.mNumIndices; ++c) {
            f.mIndices[c] = idx++;
        }
    }

    ai_assert(idx == mesh->mNumVertices);

    mesh->mPrimitiveTypes = m.pflags;
    mesh->mMaterialIndex = m.matid;
    return mesh.release();
}